

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override_overload_overwrite.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Base *this;
  Base *this_00;
  Derived *pD;
  Base *pBase;
  char **argv_local;
  int argc_local;
  
  this = (Base *)operator_new(8);
  memset(this,0,8);
  Derived::Derived((Derived *)this);
  Base::F(this);
  (**this->_vptr_Base)();
  Base::Add(this,1,2);
  Base::Add(this,1.2,2.1);
  this_00 = (Base *)operator_new(8);
  memset(this_00,0,8);
  Derived::Derived((Derived *)this_00);
  Derived::F((Derived *)this_00);
  (**this_00->_vptr_Base)();
  Base::Add(this_00,1,2);
  Base::Add(this_00,2.1,1.2);
  if (this != (Base *)0x0) {
    operator_delete(this,8);
  }
  if (this_00 != (Base *)0x0) {
    operator_delete(this_00,8);
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Base* pBase = new Derived();
	pBase->F(); // Base.F
	pBase->G(); // Derived.G
	pBase->Add(1, 2);
	pBase->Add(1.2f, 2.1f);


	Derived* pD = new Derived();
	pD->F(); // Derived.F
	pD->G(); // Derived.G
	pD->Add(1, 2);
	pD->Add(2.1f, 1.2f);

	delete pBase;
	delete pD;

	return 0;
}